

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O2

void av1_fwd_txfm2d_64x32_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [2048];
  
  av1_get_fwd_txfm_cfg(tx_type,'\f',&cfg);
  fwd_txfm2d_c(input,output,stride,&cfg,txfm_buf,bd);
  memset(output + 0x400,0,0x1000);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x32_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  int32_t txfm_buf[64 * 32];
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X32, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out the bottom 32x32 area.
  memset(output + 32 * 32, 0, 32 * 32 * sizeof(*output));
  // Note: no repacking needed here.
}